

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void geopolyJsonFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  GeoPoly *p;
  sqlite3_str *p_00;
  char *z;
  long lVar1;
  
  p = geopolyFuncParam(context,*argv,(int *)0x0);
  if (p != (GeoPoly *)0x0) {
    p_00 = sqlite3_str_new(context->pOut->db);
    sqlite3_str_append(p_00,"[",1);
    for (lVar1 = 0; lVar1 < p->nVertex; lVar1 = lVar1 + 1) {
      sqlite3_str_appendf(p_00,"[%!g,%!g],",(double)p->a[lVar1 * 2],(double)p->a[lVar1 * 2 + 1]);
    }
    sqlite3_str_appendf(p_00,"[%!g,%!g]]",(double)p->a[0],(double)p->a[1]);
    z = sqlite3_str_finish(p_00);
    sqlite3_result_text(context,z,-1,sqlite3_free);
    sqlite3_free(p);
    return;
  }
  return;
}

Assistant:

static void geopolyJsonFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p = geopolyFuncParam(context, argv[0], 0);
  (void)argc;
  if( p ){
    sqlite3 *db = sqlite3_context_db_handle(context);
    sqlite3_str *x = sqlite3_str_new(db);
    int i;
    sqlite3_str_append(x, "[", 1);
    for(i=0; i<p->nVertex; i++){
      sqlite3_str_appendf(x, "[%!g,%!g],", GeoX(p,i), GeoY(p,i));
    }
    sqlite3_str_appendf(x, "[%!g,%!g]]", GeoX(p,0), GeoY(p,0));
    sqlite3_result_text(context, sqlite3_str_finish(x), -1, sqlite3_free);
    sqlite3_free(p);
  }
}